

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_orient_node0(REF_INT nnode,REF_INT node0,REF_INT *nodes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_INT RVar4;
  REF_STATUS RVar5;
  
  if (nnode == 4) {
    iVar1 = *nodes;
    RVar5 = 0;
    if (iVar1 != node0) {
      iVar2 = nodes[1];
      if (iVar2 == node0) {
        *nodes = node0;
        nodes[1] = iVar1;
        *(ulong *)(nodes + 2) =
             CONCAT44((int)*(undefined8 *)(nodes + 2),
                      (int)((ulong)*(undefined8 *)(nodes + 2) >> 0x20));
      }
      else {
        iVar3 = nodes[2];
        RVar5 = 0;
        if (iVar3 == node0) {
          *nodes = node0;
          nodes[2] = iVar1;
          RVar4 = nodes[3];
          nodes[3] = iVar2;
          nodes[1] = RVar4;
        }
        else if (nodes[3] == node0) {
          *nodes = node0;
          nodes[3] = iVar1;
          nodes[2] = iVar2;
          nodes[1] = iVar3;
        }
        else {
          RVar5 = 5;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x3f9,"ref_cell_orient_node0",5,"node0 not found in nodes");
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x3db,
           "ref_cell_orient_node0","only implemented for tets",4,(long)nnode);
    RVar5 = 1;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_cell_orient_node0(REF_INT nnode, REF_INT node0,
                                         REF_INT *nodes) {
  REF_INT temp;
  REIS(4, nnode, "only implemented for tets");
  if (node0 == nodes[0]) return REF_SUCCESS;
  if (node0 == nodes[1]) {
    temp = nodes[0];
    nodes[0] = nodes[1];
    nodes[1] = temp;
    temp = nodes[2];
    nodes[2] = nodes[3];
    nodes[3] = temp;
    return REF_SUCCESS;
  }
  if (node0 == nodes[2]) {
    temp = nodes[0];
    nodes[0] = nodes[2];
    nodes[2] = temp;
    temp = nodes[3];
    nodes[3] = nodes[1];
    nodes[1] = temp;
    return REF_SUCCESS;
  }
  if (node0 == nodes[3]) {
    temp = nodes[0];
    nodes[0] = nodes[3];
    nodes[3] = temp;
    temp = nodes[2];
    nodes[2] = nodes[1];
    nodes[1] = temp;
    return REF_SUCCESS;
  }

  RSS(REF_NOT_FOUND, "node0 not found in nodes");
  return REF_SUCCESS;
}